

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile-functor.cpp
# Opt level: O0

Tile __thiscall mahjong::NextTile::operator()(NextTile *this,Tile *tile)

{
  ulong uVar1;
  int iVar2;
  undefined4 local_24;
  int next;
  int number;
  int suit;
  int code;
  Tile *tile_local;
  NextTile *this_local;
  
  iVar2 = (int)*tile / 100;
  uVar1 = (long)(int)*tile / 10;
  local_24 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 10) + 1;
  if (((0 < iVar2) && (iVar2 < 4)) && (9 < local_24)) {
    local_24 = 1;
  }
  if ((iVar2 == 4) && (4 < local_24)) {
    local_24 = 1;
  }
  if ((iVar2 == 5) && (3 < local_24)) {
    local_24 = 1;
  }
  return iVar2 * 100 + local_24 * 10;
}

Assistant:

Tile NextTile::operator()(const Tile& tile) const
{
	auto code = static_cast<int>(tile);
	auto suit = code / 100;
	auto number = code / 10 % 10;

	number++;

	if (1 <= suit && suit <= 3 && 9 < number) number = 1;
	if (4 == suit && 4 < number) number = 1;
	if (5 == suit && 3 < number) number = 1;

	auto next = suit * 100 + number * 10;
	return static_cast<Tile>(next);
}